

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_3x3_pack16to1.h
# Opt level: O3

void ncnn::conv3x3s1_pack16to1_avx512
               (Mat *bottom_blob,Mat *top_blob,Mat *kernel,Mat *_bias,Option *opt)

{
  uint *puVar1;
  undefined1 auVar2 [64];
  undefined1 auVar3 [64];
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  int iVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  void *pvVar12;
  size_t sVar13;
  size_t sVar14;
  void *pvVar15;
  void *pvVar16;
  size_t sVar17;
  size_t sVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  bool bVar26;
  bool bVar27;
  bool bVar28;
  bool bVar29;
  bool bVar30;
  bool bVar31;
  bool bVar32;
  undefined8 uVar33;
  undefined8 uVar34;
  byte bVar35;
  int iVar36;
  ulong uVar37;
  long lVar38;
  long lVar39;
  long lVar40;
  void *pvVar41;
  long lVar42;
  ulong uVar43;
  long lVar44;
  undefined1 (*pauVar45) [64];
  int iVar46;
  float *pfVar47;
  long lVar48;
  ushort uVar49;
  undefined1 auVar50 [32];
  undefined1 auVar51 [64];
  undefined1 auVar52 [64];
  undefined1 auVar53 [64];
  undefined1 auVar54 [64];
  undefined1 auVar55 [64];
  undefined1 auVar56 [64];
  undefined1 auVar57 [64];
  undefined1 auVar58 [16];
  float fVar61;
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  int size;
  
  iVar8 = top_blob->c;
  if (0 < (long)iVar8) {
    iVar9 = top_blob->w;
    uVar10 = top_blob->h;
    uVar11 = bottom_blob->c;
    pvVar12 = top_blob->data;
    uVar37 = top_blob->elemsize;
    lVar40 = top_blob->cstep * uVar37;
    lVar48 = 0;
    iVar36 = (int)((uVar37 * (long)(int)uVar10 * (long)iVar9 + 0xf & 0xfffffffffffffff0) / uVar37);
    if (top_blob->dims == 4) {
      iVar36 = (int)((long)(int)uVar10 * (long)iVar9);
    }
    iVar36 = iVar36 * top_blob->d;
    sVar13 = kernel->cstep;
    sVar14 = kernel->elemsize;
    pvVar15 = kernel->data;
    pvVar16 = bottom_blob->data;
    sVar17 = bottom_blob->elemsize;
    sVar18 = bottom_blob->cstep;
    auVar51 = vpbroadcastq_avx512f();
    lVar44 = (long)bottom_blob->w * sVar17;
    auVar52 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar53 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    pvVar41 = pvVar12;
    do {
      if (_bias == (Mat *)0x0) {
        auVar58 = ZEXT816(0) << 0x40;
      }
      else {
        auVar58 = ZEXT416(*(uint *)((long)&_bias->data + lVar48 * 4));
      }
      if (0 < iVar36) {
        auVar54 = vbroadcastss_avx512f(auVar58);
        uVar37 = 0;
        do {
          auVar55 = vpbroadcastq_avx512f();
          auVar56 = vporq_avx512f(auVar55,auVar52);
          auVar55 = vporq_avx512f(auVar55,auVar53);
          uVar33 = vpcmpuq_avx512f(auVar55,auVar51,2);
          uVar34 = vpcmpuq_avx512f(auVar56,auVar51,2);
          bVar35 = (byte)uVar34;
          uVar49 = CONCAT11(bVar35,(byte)uVar33);
          puVar1 = (uint *)((long)pvVar41 + uVar37 * 4);
          bVar19 = (bool)((byte)uVar33 & 1);
          bVar20 = (bool)((byte)(uVar49 >> 1) & 1);
          bVar21 = (bool)((byte)(uVar49 >> 2) & 1);
          bVar22 = (bool)((byte)(uVar49 >> 3) & 1);
          bVar23 = (bool)((byte)(uVar49 >> 4) & 1);
          bVar24 = (bool)((byte)(uVar49 >> 5) & 1);
          bVar25 = (bool)((byte)(uVar49 >> 6) & 1);
          bVar26 = (bool)((byte)(uVar49 >> 7) & 1);
          bVar27 = (bool)(bVar35 >> 1 & 1);
          bVar28 = (bool)(bVar35 >> 2 & 1);
          bVar29 = (bool)(bVar35 >> 3 & 1);
          bVar30 = (bool)(bVar35 >> 4 & 1);
          bVar31 = (bool)(bVar35 >> 5 & 1);
          bVar32 = (bool)(bVar35 >> 6 & 1);
          *puVar1 = (uint)bVar19 * auVar54._0_4_ | (uint)!bVar19 * *puVar1;
          puVar1[1] = (uint)bVar20 * auVar54._4_4_ | (uint)!bVar20 * puVar1[1];
          puVar1[2] = (uint)bVar21 * auVar54._8_4_ | (uint)!bVar21 * puVar1[2];
          puVar1[3] = (uint)bVar22 * auVar54._12_4_ | (uint)!bVar22 * puVar1[3];
          puVar1[4] = (uint)bVar23 * auVar54._16_4_ | (uint)!bVar23 * puVar1[4];
          puVar1[5] = (uint)bVar24 * auVar54._20_4_ | (uint)!bVar24 * puVar1[5];
          puVar1[6] = (uint)bVar25 * auVar54._24_4_ | (uint)!bVar25 * puVar1[6];
          puVar1[7] = (uint)bVar26 * auVar54._28_4_ | (uint)!bVar26 * puVar1[7];
          puVar1[8] = (uint)(bVar35 & 1) * auVar54._32_4_ | (uint)!(bool)(bVar35 & 1) * puVar1[8];
          puVar1[9] = (uint)bVar27 * auVar54._36_4_ | (uint)!bVar27 * puVar1[9];
          puVar1[10] = (uint)bVar28 * auVar54._40_4_ | (uint)!bVar28 * puVar1[10];
          puVar1[0xb] = (uint)bVar29 * auVar54._44_4_ | (uint)!bVar29 * puVar1[0xb];
          puVar1[0xc] = (uint)bVar30 * auVar54._48_4_ | (uint)!bVar30 * puVar1[0xc];
          puVar1[0xd] = (uint)bVar31 * auVar54._52_4_ | (uint)!bVar31 * puVar1[0xd];
          puVar1[0xe] = (uint)bVar32 * auVar54._56_4_ | (uint)!bVar32 * puVar1[0xe];
          puVar1[0xf] = (uint)(bVar35 >> 7) * auVar54._60_4_ |
                        (uint)!(bool)(bVar35 >> 7) * puVar1[0xf];
          uVar37 = uVar37 + 0x10;
        } while ((iVar36 + 0xfU & 0xfffffff0) != uVar37);
      }
      if (0 < (int)uVar11) {
        pauVar45 = (undefined1 (*) [64])(sVar13 * sVar14 * lVar48 + (long)pvVar15);
        lVar38 = 0x80;
        uVar37 = 0;
        do {
          if (0 < (int)uVar10) {
            auVar54 = *pauVar45;
            auVar55 = pauVar45[1];
            auVar56 = pauVar45[2];
            auVar2 = pauVar45[3];
            auVar3 = pauVar45[4];
            auVar4 = pauVar45[5];
            auVar5 = pauVar45[6];
            auVar6 = pauVar45[7];
            auVar7 = pauVar45[8];
            uVar43 = 0;
            lVar42 = lVar38;
            pfVar47 = (float *)(lVar40 * lVar48 + (long)pvVar12);
            do {
              lVar39 = lVar42;
              iVar46 = iVar9;
              if (0 < iVar9) {
                do {
                  auVar57 = vmulps_avx512f(auVar54,*(undefined1 (*) [64])
                                                    ((long)pvVar16 + lVar39 + -0x80));
                  auVar57 = vfmadd231ps_avx512f(auVar57,auVar2,
                                                *(undefined1 (*) [64])
                                                 ((long)pvVar16 + lVar39 + lVar44 + -0x80));
                  auVar57 = vfmadd231ps_avx512f(auVar57,auVar5,
                                                *(undefined1 (*) [64])
                                                 ((long)pvVar16 + lVar39 + lVar44 * 2 + -0x80));
                  auVar57 = vfmadd231ps_avx512f(auVar57,auVar55,
                                                *(undefined1 (*) [64])
                                                 ((long)pvVar16 + lVar39 + -0x40));
                  auVar57 = vfmadd231ps_avx512f(auVar57,auVar3,
                                                *(undefined1 (*) [64])
                                                 ((long)pvVar16 + lVar39 + lVar44 + -0x40));
                  auVar57 = vfmadd231ps_avx512f(auVar57,auVar6,
                                                *(undefined1 (*) [64])
                                                 ((long)pvVar16 + lVar39 + lVar44 * 2 + -0x40));
                  auVar57 = vfmadd231ps_avx512f(auVar57,auVar56,
                                                *(undefined1 (*) [64])((long)pvVar16 + lVar39));
                  auVar57 = vfmadd231ps_avx512f(auVar57,auVar4,
                                                *(undefined1 (*) [64])
                                                 ((long)pvVar16 + lVar39 + lVar44));
                  auVar57 = vfmadd231ps_avx512f(auVar57,auVar7,
                                                *(undefined1 (*) [64])
                                                 ((long)pvVar16 + lVar39 + lVar44 * 2));
                  auVar50 = vextractf64x4_avx512f(auVar57,1);
                  fVar61 = auVar57._4_4_ + auVar50._4_4_;
                  auVar59._0_4_ = auVar57._0_4_ + auVar50._0_4_ + auVar57._16_4_ + auVar50._16_4_;
                  auVar59._4_4_ = fVar61 + fVar61;
                  auVar59._8_4_ = auVar57._8_4_ + auVar50._8_4_ + auVar57._24_4_ + auVar50._24_4_;
                  auVar59._12_4_ = auVar57._12_4_ + auVar50._12_4_ + auVar57._28_4_ + auVar50._28_4_
                  ;
                  auVar58 = vshufpd_avx(auVar59,auVar59,1);
                  auVar60._0_4_ = auVar58._0_4_ + auVar59._0_4_;
                  auVar60._4_4_ = auVar58._4_4_ + auVar59._4_4_;
                  auVar60._8_4_ = auVar58._8_4_ + auVar59._8_4_;
                  auVar60._12_4_ = auVar58._12_4_ + auVar59._12_4_;
                  auVar58 = vmovshdup_avx(auVar60);
                  *pfVar47 = auVar58._0_4_ + *pfVar47 + auVar60._0_4_;
                  pfVar47 = pfVar47 + 1;
                  iVar46 = iVar46 + -1;
                  lVar39 = lVar39 + 0x40;
                } while (iVar46 != 0);
              }
              uVar43 = uVar43 + 1;
              lVar42 = lVar42 + lVar44;
            } while (uVar43 != uVar10);
          }
          pauVar45 = pauVar45 + 9;
          uVar37 = uVar37 + 1;
          lVar38 = lVar38 + sVar18 * sVar17;
        } while (uVar37 != uVar11);
      }
      lVar48 = lVar48 + 1;
      pvVar41 = (void *)((long)pvVar41 + lVar40);
    } while (lVar48 != iVar8);
  }
  return;
}

Assistant:

static void conv3x3s1_pack16to1_avx512(const Mat& bottom_blob, Mat& top_blob, const Mat& kernel, const Mat& _bias, const Option& opt)
{
    int inch = bottom_blob.c;
    int outw = top_blob.w;
    int outh = top_blob.h;
    int outch = top_blob.c;

    const float* bias = _bias;

    int remain_outch_start = 0;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = remain_outch_start; p < outch; p++)
    {
        Mat out0 = top_blob.channel(p);

        const float bias0 = bias ? bias[p] : 0.f;
        out0.fill(bias0);

        const float* k0 = kernel.channel(p);

        for (int q = 0; q < inch; q++)
        {
            float* outptr0 = out0.row(0);

            const Mat img0 = bottom_blob.channel(q);

            __m512 _k00 = _mm512_loadu_ps(k0);
            __m512 _k01 = _mm512_loadu_ps(k0 + 16);
            __m512 _k02 = _mm512_loadu_ps(k0 + 16 * 2);
            __m512 _k10 = _mm512_loadu_ps(k0 + 16 * 3);
            __m512 _k11 = _mm512_loadu_ps(k0 + 16 * 4);
            __m512 _k12 = _mm512_loadu_ps(k0 + 16 * 5);
            __m512 _k20 = _mm512_loadu_ps(k0 + 16 * 6);
            __m512 _k21 = _mm512_loadu_ps(k0 + 16 * 7);
            __m512 _k22 = _mm512_loadu_ps(k0 + 16 * 8);

            int i = 0;

            for (; i < outh; i++)
            {
                const float* r0 = img0.row(i);
                const float* r1 = img0.row(i + 1);
                const float* r2 = img0.row(i + 2);

                int j = 0;
                for (; j < outw; j++)
                {
                    __m512 _r00 = _mm512_loadu_ps(r0);
                    __m512 _r01 = _mm512_loadu_ps(r0 + 16);
                    __m512 _r02 = _mm512_loadu_ps(r0 + 32);

                    __m512 _sum0 = _mm512_mul_ps(_k00, _r00);
                    __m512 _sum1 = _mm512_mul_ps(_k01, _r01);
                    __m512 _sum2 = _mm512_mul_ps(_k02, _r02);

                    __m512 _r10 = _mm512_loadu_ps(r1);
                    __m512 _r11 = _mm512_loadu_ps(r1 + 16);
                    __m512 _r12 = _mm512_loadu_ps(r1 + 32);

                    _sum0 = _mm512_fmadd_ps(_k10, _r10, _sum0);
                    _sum1 = _mm512_fmadd_ps(_k11, _r11, _sum1);
                    _sum2 = _mm512_fmadd_ps(_k12, _r12, _sum2);

                    __m512 _r20 = _mm512_loadu_ps(r2);
                    __m512 _r21 = _mm512_loadu_ps(r2 + 16);
                    __m512 _r22 = _mm512_loadu_ps(r2 + 32);

                    _sum0 = _mm512_fmadd_ps(_k20, _r20, _sum0);
                    _sum1 = _mm512_fmadd_ps(_k21, _r21, _sum1);
                    _sum2 = _mm512_fmadd_ps(_k22, _r22, _sum2);

                    __m512 _sum = _mm512_add_ps(_sum0, _mm512_add_ps(_sum1, _sum2));

                    *outptr0 += _mm512_comp_reduce_add_ps(_sum);
                    outptr0++;
                    r0 += 16;
                    r1 += 16;
                    r2 += 16;
                }
            }

            k0 += 9 * 16;
        }
    }
}